

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::cleanup(EventLoop *this,EVP_PKEY_CTX *ctx)

{
  TimerData *this_00;
  bool bVar1;
  __int_type _Var2;
  __weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2> *this_01;
  reference ppEVar3;
  reference ppTVar4;
  _union_1457 local_e0;
  sigaction act;
  TimerData *timer;
  iterator __end1;
  iterator __begin1;
  TimersById *__range1;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> locker;
  EventLoop *this_local;
  
  locker._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mMutex);
  this_01 = &localEventLoop()->super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>;
  std::__weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>::reset(this_01);
  while (bVar1 = std::queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_>::empty
                           (&this->mEvents), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppEVar3 = std::queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_>::front
                        (&this->mEvents);
    if (*ppEVar3 != (value_type)0x0) {
      (*(*ppEVar3)->_vptr_Event[1])();
    }
    std::queue<Event_*,_std::deque<Event_*,_std::allocator<Event_*>_>_>::pop(&this->mEvents);
  }
  __end1 = std::
           unordered_set<EventLoop::TimerData_*,_EventLoop::TimerDataHash,_EventLoop::TimerDataHash,_std::allocator<EventLoop::TimerData_*>_>
           ::begin(&this->mTimersById);
  timer = (TimerData *)
          std::
          unordered_set<EventLoop::TimerData_*,_EventLoop::TimerDataHash,_EventLoop::TimerDataHash,_std::allocator<EventLoop::TimerData_*>_>
          ::end(&this->mTimersById);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.super__Node_iterator_base<EventLoop::TimerData_*,_true>,
                            (_Node_iterator_base<EventLoop::TimerData_*,_true> *)&timer), bVar1) {
    ppTVar4 = std::__detail::_Node_iterator<EventLoop::TimerData_*,_true,_true>::operator*(&__end1);
    this_00 = *ppTVar4;
    act.sa_restorer = (_func_void *)this_00;
    if (this_00 != (TimerData *)0x0) {
      TimerData::~TimerData(this_00);
      operator_delete(this_00);
    }
    std::__detail::_Node_iterator<EventLoop::TimerData_*,_true,_true>::operator++(&__end1);
  }
  std::
  unordered_set<EventLoop::TimerData_*,_EventLoop::TimerDataHash,_EventLoop::TimerDataHash,_std::allocator<EventLoop::TimerData_*>_>
  ::clear(&this->mTimersById);
  std::
  multiset<EventLoop::TimerData_*,_EventLoop::TimerDataSet,_std::allocator<EventLoop::TimerData_*>_>
  ::clear(&this->mTimersByTime);
  this->mNextTimerId = 0;
  if ((this->mFlags & 6) != 0) {
    memset(&local_e0,0,0x98);
    local_e0.sa_handler = (__sighandler_t)0x0;
    if ((this->mFlags & 2) != 0) {
      sigaction(2,(sigaction *)&local_e0,(sigaction *)0x0);
    }
    if ((this->mFlags & 4) != 0) {
      sigaction(0xf,(sigaction *)&local_e0,(sigaction *)0x0);
    }
  }
  if (this->mPollFd != -1) {
    close(this->mPollFd);
  }
  if (this->mEventPipe[0] != -1) {
    close(this->mEventPipe[0]);
  }
  if (this->mEventPipe[1] != -1) {
    close(this->mEventPipe[1]);
  }
  if ((this->mFlags & 1) != 0) {
    std::__weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>::reset
              (&sMainLoop.super___weak_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>);
  }
  if ((this->mFlags & 2) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base *)&sMainEventPipe);
    if (_Var2 < 0) {
      __assert_fail("sMainEventPipe >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/EventLoop.cpp"
                    ,0x142,"void EventLoop::cleanup()");
    }
    std::__atomic_base<int>::operator=(&sMainEventPipe.super___atomic_base<int>,-1);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void EventLoop::cleanup()
{
    std::lock_guard<std::mutex> locker(mMutex);
    localEventLoop().reset();

    while (!mEvents.empty()) {
        delete mEvents.front();
        mEvents.pop();
    }

    for (auto timer : mTimersById) {
        delete timer;
    }
    mTimersById.clear();
    mTimersByTime.clear();
    mNextTimerId = 0;

#ifndef _WIN32
    if (mFlags & (EnableSigIntHandler | EnableSigTermHandler)) {
        struct sigaction act;
        memset(&act, 0, sizeof act);
        act.sa_handler = SIG_DFL;

        if (mFlags & EnableSigIntHandler) {
            ::sigaction(SIGINT, &act, 0);
        }

        if (mFlags & EnableSigTermHandler) {
            ::sigaction(SIGTERM, &act, 0);
        }
    }
#endif

#if defined(HAVE_EPOLL) || defined(HAVE_KQUEUE)
    if (mPollFd != -1)
        ::close(mPollFd);
#endif

    if (mEventPipe[0] != -1)
        ::close(mEventPipe[0]);
    if (mEventPipe[1] != -1)
        ::close(mEventPipe[1]);
    if (mFlags & MainEventLoop)
        sMainLoop.reset();
#ifndef _WIN32
    if (mFlags & EnableSigIntHandler) {
        assert(sMainEventPipe >= 0);
        sMainEventPipe = -1;
    }
#endif
}